

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChBody::GetContactPointSpeed
          (ChVector<double> *__return_storage_ptr__,ChBody *this,ChVector<double> *loc_point,
          ChState *state_x,ChStateDelta *state_w)

{
  ChVector<double> *v;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChVector<double> abs_vel;
  ChVector<double> abs_omg;
  ChVector<double> loc_omg;
  ChCoordsys<double> csys;
  ChVector<double> local_c0;
  double *local_a8;
  double local_a0;
  double local_98;
  ChState *local_90;
  undefined8 local_88;
  long local_78;
  ChVector<double> local_70;
  ChCoordsys<double> local_58;
  
  local_a8 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_78 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_a0 = 3.45845952088873e-323;
  local_88 = 0;
  local_90 = state_x;
  if (6 < local_78) {
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_58,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_a8,(type *)0x0);
    local_a8 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_78 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_a0 = 1.48219693752374e-323;
    local_88 = 0;
    local_90 = (ChState *)state_w;
    if (2 < local_78) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_c0,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_a8,(type *)0x0);
      local_78 = (state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_a8 = (state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3
      ;
      local_a0 = 1.48219693752374e-323;
      local_88 = 3;
      local_90 = (ChState *)state_w;
      if (5 < local_78) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_70,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_a8,(type *)0x0);
        ChCoordsys<double>::TransformDirectionLocalToParent(&local_58,&local_70);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_a8;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_a0;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = loc_point->m_data[2];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_98;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = loc_point->m_data[0];
        auVar8._8_8_ = 0;
        auVar8._0_8_ = loc_point->m_data[1];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = loc_point->m_data[1] * local_98;
        auVar2 = vfmsub231sd_fma(auVar9,auVar2,auVar4);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = loc_point->m_data[2] * (double)local_a8;
        auVar4 = vfmsub231sd_fma(auVar5,auVar7,auVar6);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = loc_point->m_data[0] * local_a0;
        auVar1 = vfmsub231sd_fma(auVar3,auVar1,auVar8);
        __return_storage_ptr__->m_data[0] = 0.0;
        __return_storage_ptr__->m_data[1] = 0.0;
        __return_storage_ptr__->m_data[2] = 0.0;
        __return_storage_ptr__->m_data[0] = auVar2._0_8_ + local_c0.m_data[0];
        __return_storage_ptr__->m_data[1] = auVar4._0_8_ + local_c0.m_data[1];
        __return_storage_ptr__->m_data[2] = auVar1._0_8_ + local_c0.m_data[2];
        return __return_storage_ptr__;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

ChVector<> ChBody::GetContactPointSpeed(const ChVector<>& loc_point,
                                        const ChState& state_x,
                                        const ChStateDelta& state_w) {
    ChCoordsys<> csys(state_x.segment(0, 7));
    ChVector<> abs_vel(state_w.segment(0, 3));
    ChVector<> loc_omg(state_w.segment(3, 3));
    ChVector<> abs_omg = csys.TransformDirectionLocalToParent(loc_omg);

    return abs_vel + Vcross(abs_omg, loc_point);
}